

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

Host * __thiscall Vault::Client::getHost_abi_cxx11_(Host *__return_storage_ptr__,Client *this)

{
  Client *this_local;
  
  Tiny<Vault::HostDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(__return_storage_ptr__,&this->host_);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual Host getHost() const { return host_; }